

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Toplex_map.h
# Opt level: O0

bool Gudhi::
     included<std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>,std::vector<unsigned_long,std::allocator<unsigned_long>>>
               (set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                *vertex_range1,vector<unsigned_long,_std::allocator<unsigned_long>_> *vertex_range2)

{
  bool bVar1;
  const_iterator __first;
  const_iterator __last;
  reference __x;
  size_type sVar2;
  Vertex *v;
  iterator __end0;
  iterator __begin0;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *__range2;
  undefined1 local_50 [8];
  Simplex s2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *vertex_range2_local;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *vertex_range1_local;
  
  s2._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)vertex_range2;
  __first = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(vertex_range2);
  __last = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                      s2._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>::
  set<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>> *)local_50,
             (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )__first._M_current,
             (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )__last._M_current);
  __end0 = std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::begin
                     (vertex_range1);
  v = (Vertex *)
      std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::end
                (vertex_range1);
  do {
    bVar1 = std::operator!=(&__end0,(_Self *)&v);
    if (!bVar1) {
      vertex_range1_local._7_1_ = true;
LAB_00114368:
      std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::~set
                ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
                 local_50);
      return vertex_range1_local._7_1_;
    }
    __x = std::_Rb_tree_const_iterator<unsigned_long>::operator*(&__end0);
    sVar2 = std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::count
                      ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                        *)local_50,__x);
    if (sVar2 == 0) {
      vertex_range1_local._7_1_ = false;
      goto LAB_00114368;
    }
    std::_Rb_tree_const_iterator<unsigned_long>::operator++(&__end0);
  } while( true );
}

Assistant:

bool included(const Input_vertex_range1& vertex_range1, const Input_vertex_range2& vertex_range2) {
  Toplex_map::Simplex s2(vertex_range2.begin(), vertex_range2.end());
  for (const Toplex_map::Vertex& v : vertex_range1)
    if (!s2.count(v)) return false;
  return true;
}